

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidTolerancesAndFlags(ON_Brep *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ON_BrepVertex *pOVar7;
  ON_BrepEdge *pOVar8;
  ON_BrepFace *pOVar9;
  ON_BrepTrim *pOVar10;
  ON_BrepLoop *pOVar11;
  uint local_48;
  uint local_44;
  int li;
  int ti;
  int fi;
  int ei;
  int vi;
  int face_count;
  int loop_count;
  int trim_count;
  int edge_count;
  int vertex_count;
  ON_TextLog *text_log_local;
  ON_Brep *this_local;
  
  iVar2 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
  iVar3 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
  iVar4 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  iVar5 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
  iVar6 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  fi = 0;
  while( true ) {
    if (iVar2 <= fi) {
      ti = 0;
      while( true ) {
        if (iVar3 <= ti) {
          li = 0;
          while( true ) {
            if (iVar6 <= li) {
              local_44 = 0;
              while( true ) {
                if (iVar4 <= (int)local_44) {
                  local_48 = 0;
                  while( true ) {
                    if (iVar5 <= (int)local_48) {
                      return true;
                    }
                    pOVar11 = ON_ClassArray<ON_BrepLoop>::operator[]
                                        ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,local_48);
                    if ((pOVar11->m_loop_index != -1) &&
                       (bVar1 = IsValidLoopTolerancesAndFlags(this,local_48,text_log), !bVar1))
                    break;
                    local_48 = local_48 + 1;
                  }
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"ON_Brep.m_L[%d] is invalid.\n",(ulong)local_48);
                  }
                  return false;
                }
                pOVar10 = ON_ClassArray<ON_BrepTrim>::operator[]
                                    ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_44);
                if ((pOVar10->m_trim_index != -1) &&
                   (bVar1 = IsValidTrimTolerancesAndFlags(this,local_44,text_log), !bVar1)) break;
                local_44 = local_44 + 1;
              }
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"ON_Brep.m_T[%d] is invalid.\n",(ulong)local_44);
              }
              return false;
            }
            pOVar9 = ON_ClassArray<ON_BrepFace>::operator[]
                               ((ON_ClassArray<ON_BrepFace> *)&this->m_F,li);
            if ((pOVar9->m_face_index != -1) &&
               (bVar1 = IsValidFaceTolerancesAndFlags(this,li,text_log), !bVar1)) break;
            li = li + 1;
          }
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"ON_Brep.m_F[%d] is invalid.\n",(ulong)(uint)li);
          }
          return false;
        }
        pOVar8 = ON_ClassArray<ON_BrepEdge>::operator[]((ON_ClassArray<ON_BrepEdge> *)&this->m_E,ti)
        ;
        if ((pOVar8->m_edge_index != -1) &&
           (bVar1 = IsValidEdgeTolerancesAndFlags(this,ti,text_log), !bVar1)) break;
        ti = ti + 1;
      }
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep.m_E[%d] is invalid.\n",(ulong)(uint)ti);
      }
      return false;
    }
    pOVar7 = ON_ClassArray<ON_BrepVertex>::operator[]((ON_ClassArray<ON_BrepVertex> *)&this->m_V,fi)
    ;
    if ((pOVar7->m_vertex_index != -1) &&
       (bVar1 = IsValidVertexTolerancesAndFlags(this,fi,text_log), !bVar1)) break;
    fi = fi + 1;
  }
  if (text_log != (ON_TextLog *)0x0) {
    ON_TextLog::Print(text_log,"ON_Brep.m_V[%d] is invalid.\n",(ulong)(uint)fi);
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidTolerancesAndFlags( ON_TextLog* text_log ) const
{
  const int vertex_count  = m_V.Count();
  const int edge_count    = m_E.Count();
  const int trim_count    = m_T.Count();
  const int loop_count    = m_L.Count();
  const int face_count    = m_F.Count();

  int vi, ei, fi, ti, li;

  // check vertices
  for ( vi = 0; vi < vertex_count; vi++ ) {
    if ( m_V[vi].m_vertex_index == -1 )
      continue;
    if ( !IsValidVertexTolerancesAndFlags( vi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_V[%d] is invalid.\n",vi);
      return false;
    }
  }

  // check edges
  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
      continue;
    if ( !IsValidEdgeTolerancesAndFlags( ei, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_E[%d] is invalid.\n",ei);
      return false;
    }
  }

  // check faces
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
      continue;
    if ( !IsValidFaceTolerancesAndFlags( fi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_F[%d] is invalid.\n",fi);
      return false;
    }
  }

  // check trims
  for ( ti = 0; ti < trim_count; ti++ )
  {
    if ( m_T[ti].m_trim_index == -1 )
      continue;
    if ( !IsValidTrimTolerancesAndFlags( ti, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_T[%d] is invalid.\n",ti);
      return false;
    }
  }

  // check loops
  for ( li = 0; li < loop_count; li++ )
  {
    if ( m_L[li].m_loop_index == -1 )
      continue;
    if ( !IsValidLoopTolerancesAndFlags( li, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d] is invalid.\n",li);
      return false;
    }
  }

  return true;
}